

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtio.c
# Opt level: O1

void virtio_read_stats(ixy_device *ixy,device_stats *stats)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  
  if (stats != (device_stats *)0x0) {
    auVar2._0_8_ = stats->rx_pkts;
    auVar2._8_8_ = stats->tx_pkts;
    auVar2._16_8_ = stats->rx_bytes;
    auVar2._24_8_ = stats->tx_bytes;
    auVar1._0_8_ = ixy[1].tx_batch;
    auVar1._8_8_ = ixy[1].read_stats;
    auVar1._16_8_ = ixy[1].set_promisc;
    auVar1._24_8_ = ixy[1].get_link_speed;
    auVar2 = vpaddq_avx2(auVar2,auVar1);
    stats->rx_pkts = auVar2._0_8_;
    stats->tx_pkts = auVar2._8_8_;
    stats->rx_bytes = auVar2._16_8_;
    stats->tx_bytes = auVar2._24_8_;
  }
  ixy[1].tx_batch = (_func_uint32_t_ixy_device_ptr_uint16_t_pkt_buf_ptr_ptr_uint32_t *)0x0;
  ixy[1].read_stats = (_func_void_ixy_device_ptr_device_stats_ptr *)0x0;
  ixy[1].set_promisc = (_func_void_ixy_device_ptr__Bool *)0x0;
  ixy[1].get_link_speed = (_func_uint32_t_ixy_device_ptr *)0x0;
  return;
}

Assistant:

void virtio_read_stats(struct ixy_device* ixy, struct device_stats* stats) {
	struct virtio_device* dev = IXY_TO_VIRTIO(ixy);
	if (stats) {
		stats->rx_pkts += dev->rx_pkts;
		stats->tx_pkts += dev->tx_pkts;
		stats->rx_bytes += dev->rx_bytes;
		stats->tx_bytes += dev->tx_bytes;
	}
	dev->rx_pkts = dev->tx_pkts = dev->rx_bytes = dev->tx_bytes = 0;
}